

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

void __thiscall udpdiscovery::impl::PeerEnv::deleteIdle(PeerEnv *this,long cur_time_ms)

{
  bool bVar1;
  reference this_00;
  long lVar2;
  long lVar3;
  size_type sVar4;
  reference p_Var5;
  size_type local_58;
  size_t i;
  _Self local_38;
  iterator it;
  vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  to_delete;
  long cur_time_ms_local;
  PeerEnv *this_local;
  
  MinimalisticMutex::Lock(&this->lock_);
  std::
  vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  ::vector((vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
            *)&it);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::begin
                 (&this->discovered_peers_);
  while( true ) {
    i = (size_t)std::__cxx11::
                list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
                end(&this->discovered_peers_);
    bVar1 = std::operator!=(&local_38,(_Self *)&i);
    if (!bVar1) break;
    this_00 = std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator*(&local_38);
    lVar2 = DiscoveredPeer::last_updated(this_00);
    lVar3 = PeerParameters::discovered_peer_ttl_ms(&this->parameters_);
    if (lVar3 < cur_time_ms - lVar2) {
      std::
      vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
      ::push_back((vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                   *)&it,&local_38);
    }
    std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator++(&local_38);
  }
  local_58 = 0;
  while( true ) {
    sVar4 = std::
            vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
            ::size((vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                    *)&it);
    if (sVar4 <= local_58) break;
    p_Var5 = std::
             vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
             ::operator[]((vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                           *)&it,local_58);
    std::__cxx11::list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
    ::erase(&this->discovered_peers_,p_Var5->_M_node);
    local_58 = local_58 + 1;
  }
  MinimalisticMutex::Unlock(&this->lock_);
  std::
  vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  ::~vector((vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
             *)&it);
  return;
}

Assistant:

void deleteIdle(long cur_time_ms) {
    lock_.Lock();

    std::vector<std::list<DiscoveredPeer>::iterator> to_delete;
    for (std::list<DiscoveredPeer>::iterator it = discovered_peers_.begin();
         it != discovered_peers_.end(); ++it) {
      if (cur_time_ms - (*it).last_updated() >
          parameters_.discovered_peer_ttl_ms())
        to_delete.push_back(it);
    }

    for (size_t i = 0; i < to_delete.size(); ++i)
      discovered_peers_.erase(to_delete[i]);

    lock_.Unlock();
  }